

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenSwitch(BinaryenModuleRef module,char **names,BinaryenIndex numNames,char *defaultName,
              BinaryenExpressionRef condition,BinaryenExpressionRef value)

{
  char *__s;
  Switch *this;
  IString *pIVar1;
  undefined1 reuse;
  ulong uVar2;
  string_view s;
  string_view sVar3;
  
  reuse = SUB81(defaultName,0);
  this = (Switch *)MixedArena::allocSpace(&module->allocator,0x50,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id = SwitchId;
  (this->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (this->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (this->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0;
  (this->targets).allocator = &module->allocator;
  (this->default_).super_IString.str._M_len = 0;
  (this->default_).super_IString.str._M_str = (char *)0x0;
  this->value = (Expression *)0x0;
  this->condition = (Expression *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression.type.id = 1;
  if (numNames != 0) {
    uVar2 = 0;
    do {
      __s = names[uVar2];
      pIVar1 = (IString *)strlen(__s);
      sVar3._M_str = (char *)0x0;
      sVar3._M_len = (size_t)__s;
      sVar3 = wasm::IString::interned(pIVar1,sVar3,(bool)reuse);
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
                (&(this->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                 (Name)sVar3);
      uVar2 = uVar2 + 1;
    } while (numNames != uVar2);
  }
  pIVar1 = (IString *)strlen(defaultName);
  s._M_str = (char *)0x0;
  s._M_len = (size_t)defaultName;
  sVar3 = wasm::IString::interned(pIVar1,s,(bool)reuse);
  (this->default_).super_IString.str = sVar3;
  this->condition = condition;
  this->value = value;
  wasm::Switch::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSwitch(BinaryenModuleRef module,
                                     const char** names,
                                     BinaryenIndex numNames,
                                     const char* defaultName,
                                     BinaryenExpressionRef condition,
                                     BinaryenExpressionRef value) {
  auto* ret = ((Module*)module)->allocator.alloc<Switch>();
  for (BinaryenIndex i = 0; i < numNames; i++) {
    ret->targets.push_back(names[i]);
  }
  ret->default_ = defaultName;
  ret->condition = (Expression*)condition;
  ret->value = (Expression*)value;
  ret->finalize();
  return static_cast<Expression*>(ret);
}